

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

void __thiscall docopt::BranchPattern::fix_repeating_arguments(BranchPattern *this)

{
  __shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer psVar2;
  undefined8 uVar3;
  element_type *peVar4;
  pointer pvVar5;
  bool bVar6;
  Kind KVar7;
  pointer pvVar8;
  size_type sVar9;
  long *plVar10;
  string *str;
  __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  __it;
  long lVar11;
  pointer *ppvVar12;
  __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  this_00;
  undefined8 uVar13;
  __shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *p_Var14;
  long lVar15;
  value *this_01;
  initializer_list<std::shared_ptr<docopt::Pattern>_> __l;
  allocator_type local_149;
  __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  local_148;
  Variant VStack_140;
  PatternList group;
  element_type *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  either;
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  groups;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_58;
  __shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector(&local_58,&this->fChildren);
  either.
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  either.
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  either.
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  groups.
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  groups.
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  groups.
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
  ::
  emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
            ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
              *)&groups,&local_58);
  do {
    if (groups.
        super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        groups.
        super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
      ::~vector(&groups);
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector(&local_58);
      pvVar5 = either.
               super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pvVar8 = either.
               super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (pvVar8 == pvVar5) {
          std::
          vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
          ::~vector(&either);
          return;
        }
        std::
        _Hashtable<std::shared_ptr<docopt::Pattern>,std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<docopt::Pattern>>,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,false>>
        ::
        _Hashtable<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                  ((_Hashtable<std::shared_ptr<docopt::Pattern>,std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<docopt::Pattern>>,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,false>>
                    *)&groups,
                   (pvVar8->
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
                   (pvVar8->
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,0,(value *)&local_148,&group,
                   &local_f8);
        ppvVar12 = &groups.
                    super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
LAB_00152622:
        ppvVar12 = (pointer *)*ppvVar12;
        if (ppvVar12 != (pointer *)0x0) {
          sVar9 = std::
                  _Hashtable<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                  ::count((_Hashtable<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                           *)&groups,(key_type *)(ppvVar12 + 1));
          if (((sVar9 != 1) && (psVar2 = (pointer)ppvVar12[1], psVar2 != (pointer)0x0)) &&
             (plVar10 = (long *)__dynamic_cast(psVar2,&Pattern::typeinfo,&LeafPattern::typeinfo),
             plVar10 != (long *)0x0)) {
            lVar11 = __dynamic_cast(plVar10,&LeafPattern::typeinfo,&Command::typeinfo);
            if (lVar11 != 0) {
LAB_00152682:
              local_148._M_current._0_4_ = 2;
              VStack_140.longValue = 0;
              value::operator=((value *)(plVar10 + 5),(value *)&local_148);
              value::~value((value *)&local_148);
              goto LAB_00152622;
            }
            lVar11 = __dynamic_cast(plVar10,&LeafPattern::typeinfo,&Argument::typeinfo);
            if (lVar11 == 0) {
              if ((undefined **)*plVar10 != &PTR_flat_001680e8) goto LAB_00152622;
              if ((int)plVar10[0x12] == 0) goto LAB_00152682;
            }
            group.
            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            group.
            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            group.
            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            this_01 = (value *)(plVar10 + 5);
            KVar7 = *(Kind *)(plVar10 + 5);
            if (KVar7 == String) {
              str = value::asString_abi_cxx11_(this_01);
              anon_unknown.dwarf_4da67::split
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_148,str,0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&group,(value *)&local_148);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_148);
              KVar7 = this_01->kind;
            }
            if (KVar7 != StringList) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_78,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&group);
              local_148._M_current._0_4_ = 4;
              VStack_140.longValue =
                   (long)local_78.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              VStack_140.strValue._M_string_length =
                   (size_type)
                   local_78.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              VStack_140.strList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_78.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              value::operator=(this_01,(value *)&local_148);
              value::~value((value *)&local_148);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_78);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&group);
          }
          goto LAB_00152622;
        }
        std::
        _Hashtable<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
        ::~_Hashtable((_Hashtable<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                       *)&groups);
        pvVar8 = pvVar8 + 1;
      } while( true );
    }
    local_148._M_current =
         ((groups.
           super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    VStack_140.longValue =
         (long)((groups.
                 super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    VStack_140.strValue._M_string_length =
         (size_type)
         ((groups.
           super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    ((groups.
      super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((groups.
      super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((groups.
      super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __it._M_current =
         (shared_ptr<docopt::Pattern> *)
         groups.
         super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    std::
    vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
    ::erase(&groups,(const_iterator)
                    groups.
                    super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    uVar3 = VStack_140.longValue;
    lVar15 = VStack_140.longValue - (long)local_148._M_current;
    this_00._M_current = (shared_ptr<docopt::Pattern> *)local_148;
    for (lVar11 = lVar15 >> 6; uVar13 = this_00._M_current, 0 < lVar11; lVar11 = lVar11 + -1) {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::{lambda(std::shared_ptr<docopt::Pattern>const&)#1}>
              ::operator()((_Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                            *)this_00._M_current,__it);
      if (bVar6) goto LAB_00152394;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::{lambda(std::shared_ptr<docopt::Pattern>const&)#1}>
              ::operator()((_Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                            *)((long)this_00._M_current + 0x10),__it);
      uVar13 = (_Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                *)((long)this_00._M_current + 0x10);
      if (bVar6) goto LAB_00152394;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::{lambda(std::shared_ptr<docopt::Pattern>const&)#1}>
              ::operator()((_Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                            *)((long)this_00._M_current + 0x20),__it);
      uVar13 = (_Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                *)((long)this_00._M_current + 0x20);
      if (bVar6) goto LAB_00152394;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::{lambda(std::shared_ptr<docopt::Pattern>const&)#1}>
              ::operator()((_Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                            *)((long)this_00._M_current + 0x30),__it);
      uVar13 = (_Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                *)((long)this_00._M_current + 0x30);
      if (bVar6) goto LAB_00152394;
      this_00._M_current = (shared_ptr<docopt::Pattern> *)((long)this_00._M_current + 0x40);
      lVar15 = lVar15 + -0x40;
    }
    lVar15 = lVar15 >> 4;
    if (lVar15 == 1) {
LAB_0015257e:
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::{lambda(std::shared_ptr<docopt::Pattern>const&)#1}>
              ::operator()((_Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                            *)this_00._M_current,__it);
      uVar13 = this_00._M_current;
      if (!bVar6) {
        uVar13 = uVar3;
      }
LAB_00152394:
      if (uVar13 == uVar3) goto LAB_00152471;
      local_f8 = (((shared_ptr<docopt::Pattern> *)uVar13)->
                 super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      _Stack_f0._M_pi =
           (((shared_ptr<docopt::Pattern> *)uVar13)->
           super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      (((shared_ptr<docopt::Pattern> *)uVar13)->
      super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (((shared_ptr<docopt::Pattern> *)uVar13)->
      super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      erase((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)&local_148,(const_iterator)uVar13);
      peVar4 = local_f8;
      if (local_f8 == (element_type *)0x0) {
LAB_001524f7:
        lVar11 = __dynamic_cast(peVar4,&Pattern::typeinfo,&typeinfo,0);
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)&group,
                 (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)(lVar11 + 8));
        std::
        vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
        insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,void>
                  ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                    *)&group,
                   (const_iterator)
                   group.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,local_148,
                   (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                    )VStack_140.strValue._M_dataplus._M_p);
        std::
        vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
        ::
        emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                  ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                    *)&groups,
                   (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)&group);
LAB_0015253e:
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   *)&group);
      }
      else {
        lVar11 = __dynamic_cast(local_f8,&Pattern::typeinfo,&Either::typeinfo,0);
        if (lVar11 == 0) {
          lVar11 = __dynamic_cast(peVar4,&Pattern::typeinfo,&OneOrMore::typeinfo,0);
          if (lVar11 == 0) goto LAB_001524f7;
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)&group,
                   (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)(lVar11 + 8));
          std::
          vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
          ::
          insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,void>
                    ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                      *)&group,
                     (const_iterator)
                     group.
                     super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     *(shared_ptr<docopt::Pattern> **)(lVar11 + 8),
                     *(shared_ptr<docopt::Pattern> **)(lVar11 + 0x10));
          std::
          vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
          ::
          insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,void>
                    ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                      *)&group,
                     (const_iterator)
                     group.
                     super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_148,
                     (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                      )VStack_140.strValue._M_dataplus._M_p);
          std::
          vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
          ::
          emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                    ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                      *)&groups,
                     (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)&group);
          goto LAB_0015253e;
        }
        p_Var1 = *(__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> **)(lVar11 + 0x10);
        for (p_Var14 = *(__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> **)(lVar11 + 8);
            p_Var14 != p_Var1; p_Var14 = p_Var14 + 1) {
          std::__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_40,p_Var14);
          __l._M_len = 1;
          __l._M_array = (iterator)&local_40;
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)&group,__l,&local_149);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
          std::
          vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
          ::
          insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,void>
                    ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                      *)&group,
                     (const_iterator)
                     group.
                     super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_148,
                     (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                      )VStack_140.strValue._M_dataplus._M_p);
          std::
          vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
          ::
          emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                    ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                      *)&groups,
                     (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)&group);
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     *)&group);
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
    }
    else {
      if (lVar15 == 2) {
LAB_00152567:
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::{lambda(std::shared_ptr<docopt::Pattern>const&)#1}>
                ::operator()((_Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                              *)this_00._M_current,__it);
        uVar13 = this_00._M_current;
        if (!bVar6) {
          this_00._M_current = (shared_ptr<docopt::Pattern> *)((long)this_00._M_current + 0x10);
          goto LAB_0015257e;
        }
        goto LAB_00152394;
      }
      if (lVar15 == 3) {
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::{lambda(std::shared_ptr<docopt::Pattern>const&)#1}>
                ::operator()((_Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                              *)this_00._M_current,__it);
        if (!bVar6) {
          this_00._M_current = (shared_ptr<docopt::Pattern> *)((long)this_00._M_current + 0x10);
          goto LAB_00152567;
        }
        goto LAB_00152394;
      }
LAB_00152471:
      std::
      vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
      ::
      emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                  *)&either,
                 (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)&local_148);
    }
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)&local_148);
  } while( true );
}

Assistant:

PatternList const& children() const { return fChildren; }